

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_websocket.hpp
# Opt level: O2

void __thiscall
m2d::savanna::async_websocket::raw_stream_logic::on_handshake_l
          (raw_stream_logic *this,error_code ec)

{
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  if (this->delegate_ != (delegate *)0x0) {
    local_30._8_8_ = 0;
    local_18 = std::
               _Function_handler<void_(boost::beast::websocket::frame_type,_boost::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/0x0c[P]savanna/include/savanna/async_websocket.hpp:171:30)>
               ::_M_invoke;
    local_20 = std::
               _Function_handler<void_(boost::beast::websocket::frame_type,_boost::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/0x0c[P]savanna/include/savanna/async_websocket.hpp:171:30)>
               ::_M_manager;
    local_30._M_unused._M_object = this;
    boost::beast::websocket::
    stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>
    ::control_callback((this->raw_stream_).
                       super___shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(function<void_(boost::beast::websocket::frame_type,_boost::basic_string_view<char,_std::char_traits<char>_>)>
                                *)&local_30);
    std::_Function_base::~_Function_base((_Function_base *)&local_30);
    (**this->delegate_->_vptr_delegate)();
  }
  return;
}

Assistant:

void on_handshake_l(beast::error_code ec) override
			{
				// success
				if (delegate_) {
					auto control_callback = [this](beast::websocket::frame_type kind, boost::string_view payload) {
						delegate_->control_callback(kind, payload);
					};
					raw_stream_->control_callback(control_callback);
					delegate_->on_ready();
				}
			}